

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hq4x_16.cpp
# Opt level: O0

bool Diff(uint rgb1,uint rgb2)

{
  int iVar1;
  hq_vec local_58;
  hq_vec result;
  hq_vec delta;
  hq_vec delta2;
  hq_vec delta1;
  hq_vec yuv2;
  hq_vec yuv1;
  uint rgb2_local;
  uint rgb1_local;
  
  if (rgb1 == rgb2) {
    rgb2_local._3_1_ = false;
  }
  else {
    if (Diff(unsigned_int,unsigned_int)::THRESHOLD == '\0') {
      iVar1 = __cxa_guard_acquire(&Diff(unsigned_int,unsigned_int)::THRESHOLD);
      if (iVar1 != 0) {
        hq_vec::hq_vec(&Diff::THRESHOLD,0x300706);
        __cxa_guard_release(&Diff(unsigned_int,unsigned_int)::THRESHOLD);
      }
    }
    hq_vec::hq_vec(&yuv2,RGBtoYUV[rgb1]);
    hq_vec::hq_vec(&delta1,RGBtoYUV[rgb2]);
    operator-(&yuv2,&delta1);
    operator-(&delta1,&yuv2);
    operator|(&delta2,&delta);
    operator-(&result,&Diff::THRESHOLD);
    rgb2_local._3_1_ = operator!=(0,&local_58);
  }
  return rgb2_local._3_1_;
}

Assistant:

bool Diff(const unsigned int rgb1, const unsigned int rgb2)
{
  if (rgb1 == rgb2)
  {
    return false;
  }
	
  static const hq_vec THRESHOLD = 0x00300706;
  
  const hq_vec yuv1 = RGBtoYUV[rgb1];
  const hq_vec yuv2 = RGBtoYUV[rgb2];

  const hq_vec delta1 = yuv1 - yuv2;
  const hq_vec delta2 = yuv2 - yuv1;

  const hq_vec delta  = delta1 | delta2;
  const hq_vec result = delta - THRESHOLD;

  return 0 != result;
}